

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_0::ShardedLRUCache::~ShardedLRUCache(ShardedLRUCache *this)

{
  LRUCache *local_18;
  ShardedLRUCache *this_local;
  
  (this->super_Cache)._vptr_Cache = (_func_int **)&PTR__ShardedLRUCache_001ef828;
  local_18 = (LRUCache *)&this->id_mutex_;
  do {
    local_18 = local_18 + -1;
    LRUCache::~LRUCache(local_18);
  } while (local_18 != this->shard_);
  Cache::~Cache(&this->super_Cache);
  return;
}

Assistant:

~ShardedLRUCache() override {}